

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

uint8_t * __thiscall
Lodtalk::MethodAssembler::SendMessage::encode(SendMessage *this,uint8_t *buffer)

{
  uint8_t uVar1;
  int iVar2;
  undefined8 uVar3;
  
  iVar2 = this->argumentCount;
  if (iVar2 == 2) {
    iVar2 = this->selectorIndex;
    if (iVar2 < 0x10) {
      uVar1 = (char)iVar2 + 0xa0;
LAB_0014b774:
      *buffer = uVar1;
      return buffer + 1;
    }
  }
  else if (iVar2 == 1) {
    iVar2 = this->selectorIndex;
    if (iVar2 < 0x10) {
      uVar1 = (char)iVar2 + 0x90;
      goto LAB_0014b774;
    }
  }
  else if (iVar2 == 0) {
    iVar2 = this->selectorIndex;
    if (iVar2 < 0x10) {
      uVar1 = (char)iVar2 + 0x80;
      goto LAB_0014b774;
    }
  }
  else {
    if (7 < iVar2) {
      uVar3 = 0x20a;
      goto LAB_0014b7ef;
    }
    iVar2 = this->selectorIndex;
  }
  if (iVar2 < 0x20) {
    *buffer = 0xea;
    buffer[1] = ((byte)this->argumentCount & 7) + (char)this->selectorIndex * '\b';
    return buffer + 2;
  }
  uVar3 = 0x20d;
LAB_0014b7ef:
  fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
          "virtual uint8_t *Lodtalk::MethodAssembler::SendMessage::encode(uint8_t *)",
          "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MethodBuilder.cpp"
          ,uVar3);
  abort();
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(argumentCount == 0 && selectorIndex < BytecodeSet::SendShortArgs0RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs0First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 1 && selectorIndex < BytecodeSet::SendShortArgs1RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs1First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 2 && selectorIndex < BytecodeSet::SendShortArgs2RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs2First + selectorIndex);
			return buffer;
		}

		if(argumentCount > BytecodeSet::Send_ArgumentCountMask)
			LODTALK_UNIMPLEMENTED();

		if(selectorIndex > BytecodeSet::Send_LiteralIndexMask)
			LODTALK_UNIMPLEMENTED();

		*buffer++ = BytecodeSet::Send;
		*buffer++ = (argumentCount & BytecodeSet::Send_ArgumentCountMask) |
			((selectorIndex & BytecodeSet::Send_LiteralIndexMask) << BytecodeSet::Send_LiteralIndexShift);
		return buffer;
	}